

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O3

int PHYSFS_ucs4stricmp(PHYSFS_uint32 *str1,PHYSFS_uint32 *str2)

{
  uint uVar1;
  uint uVar2;
  PHYSFS_uint32 PVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  PHYSFS_uint32 *pPVar7;
  int iVar8;
  int iVar9;
  PHYSFS_uint32 folded2 [3];
  PHYSFS_uint32 folded1 [3];
  uint *local_50;
  PHYSFS_uint32 local_48 [6];
  
  iVar4 = 0;
  iVar9 = 0;
  iVar5 = 0;
  iVar8 = 0;
  local_50 = str2;
  do {
    if (iVar4 == iVar9) {
      uVar1 = *str1;
      PVar3 = uVar1;
      if (0x10fff < uVar1) {
        PVar3 = 0x3f;
      }
      str1 = str1 + (uVar1 != 0);
      pPVar7 = local_48 + 3;
      iVar4 = PHYSFS_caseFold(PVar3,pPVar7);
      iVar9 = 1;
    }
    else {
      lVar6 = (long)iVar9;
      iVar9 = iVar9 + 1;
      pPVar7 = local_48 + lVar6 + 3;
    }
    uVar1 = *pPVar7;
    if (iVar5 == iVar8) {
      uVar2 = *local_50;
      PVar3 = uVar2;
      if (0x10fff < uVar2) {
        PVar3 = 0x3f;
      }
      local_50 = local_50 + (uVar2 != 0);
      pPVar7 = local_48;
      iVar5 = PHYSFS_caseFold(PVar3,pPVar7);
      iVar8 = 1;
    }
    else {
      lVar6 = (long)iVar8;
      iVar8 = iVar8 + 1;
      pPVar7 = local_48 + lVar6;
    }
    uVar2 = *pPVar7;
    if (uVar1 < uVar2) {
      return -1;
    }
    if (uVar1 >= uVar2 && uVar1 != uVar2) {
      return 1;
    }
  } while (uVar1 != 0);
  return 0;
}

Assistant:

int PHYSFS_ucs4stricmp(const PHYSFS_uint32 *str1, const PHYSFS_uint32 *str2)
{
    UTFSTRICMP(32);
}